

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashing.c
# Opt level: O3

void sha256_hash_file_contents(char *fpath,Hash *hash)

{
  FILE *__stream;
  size_t __n;
  BYTE *data;
  size_t sVar1;
  SHA256_CTX shactx;
  SHA256_CTX SStack_98;
  
  sha256_init(&SStack_98);
  __stream = fopen(fpath,"r");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    __n = ftell(__stream);
    fseek(__stream,0,0);
    data = (BYTE *)malloc(__n + 1);
    if (data != (BYTE *)0x0) {
      sVar1 = fread(data,1,__n,__stream);
      if (sVar1 == __n) {
        data[__n] = '\0';
        fclose(__stream);
        sha256_update(&SStack_98,data,__n);
        sha256_finalize_to_cstr(&SStack_98,hash);
        free(data);
        return;
      }
      free(data);
    }
    fclose(__stream);
  }
  log_log(0x80,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/tools/perfprof/hashing.c"
          ,0x51,"%s: Failed to hash (sha256) file contents\n",fpath);
  abort();
}

Assistant:

void sha256_hash_file_contents(const char *fpath, Hash *hash) {

    SHA256_CTX shactx;
    sha256_init(&shactx);
    size_t len = 0;
    char *contents = fread_all_into_cstr(fpath, &len);
    if (contents) {
        sha256_update(&shactx, (const BYTE *)contents, len);
    } else {
        log_fatal("%s: Failed to hash (sha256) file contents\n", fpath);
        abort();
    }
    sha256_finalize_to_cstr(&shactx, hash);
    free(contents);
}